

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void * alsa_run_thread(void *context)

{
  int iVar1;
  int r;
  cubeb_conflict1 *ctx;
  
  do {
    iVar1 = alsa_run(ctx);
  } while (-1 < iVar1);
  return (void *)0x0;
}

Assistant:

static void *
alsa_run_thread(void * context)
{
  cubeb * ctx = context;
  int r;

  do {
    r = alsa_run(ctx);
  } while (r >= 0);

  return NULL;
}